

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O0

int Cut_CutProcessTwo(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1,Cut_List_t *pSuperList)

{
  int iVar1;
  Cut_Cut_t *local_38;
  Cut_Cut_t *pCut;
  Cut_List_t *pSuperList_local;
  Cut_Cut_t *pCut1_local;
  Cut_Cut_t *pCut0_local;
  Cut_Man_t *p_local;
  
  if (*(uint *)pCut0 >> 0x1c < *(uint *)pCut1 >> 0x1c) {
    local_38 = Cut_CutMergeTwo(p,pCut1,pCut0);
  }
  else {
    local_38 = Cut_CutMergeTwo(p,pCut0,pCut1);
  }
  if (local_38 == (Cut_Cut_t *)0x0) {
    return 0;
  }
  if ((p->pParams->fSeq == 0) && (*(uint *)local_38 >> 0x1c < 2)) {
    __assert_fail("p->pParams->fSeq || pCut->nLeaves > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                  ,0x142,
                  "int Cut_CutProcessTwo(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *, Cut_List_t *)");
  }
  local_38->uSign = pCut0->uSign | pCut1->uSign;
  if (p->pParams->fRecord != 0) {
    *(uint *)local_38 = *(uint *)local_38 & 0xfffff800 | *(uint *)pCut0 & 0x7ff;
    *(uint *)local_38 = *(uint *)local_38 & 0xffc007ff | (*(uint *)pCut1 & 0x7ff) << 0xb;
  }
  if (p->pParams->fFilter != 0) {
    iVar1 = Cut_CutFilterOne(p,pSuperList,local_38);
    if (iVar1 != 0) {
      return 0;
    }
    if (p->pParams->fSeq != 0) {
      if ((p->pCompareOld != (Cut_Cut_t *)0x0) &&
         (iVar1 = Cut_CutFilterOld(p,p->pCompareOld,local_38), iVar1 != 0)) {
        return 0;
      }
      if ((p->pCompareNew != (Cut_Cut_t *)0x0) &&
         (iVar1 = Cut_CutFilterOld(p,p->pCompareNew,local_38), iVar1 != 0)) {
        return 0;
      }
    }
  }
  if (p->pParams->fGlobal != 0) {
    if (p->vNodeAttrs == (Vec_Int_t *)0x0) {
      __assert_fail("p->vNodeAttrs != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                    ,0x158,
                    "int Cut_CutProcessTwo(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *, Cut_List_t *)");
    }
    iVar1 = Cut_CutFilterGlobal(p,local_38);
    if (iVar1 != 0) {
      return 0;
    }
  }
  if (p->pParams->fTruth != 0) {
    Cut_TruthCompute(p,local_38,pCut0,pCut1,p->fCompl0,p->fCompl1);
  }
  Cut_ListAdd(pSuperList,local_38);
  iVar1 = p->nNodeCuts + 1;
  p->nNodeCuts = iVar1;
  return (uint)(iVar1 == p->pParams->nKeepMax);
}

Assistant:

static inline int Cut_CutProcessTwo( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1, Cut_List_t * pSuperList )
{
    Cut_Cut_t * pCut;
    // merge the cuts
    if ( pCut0->nLeaves >= pCut1->nLeaves )
        pCut = Cut_CutMergeTwo( p, pCut0, pCut1 );
    else
        pCut = Cut_CutMergeTwo( p, pCut1, pCut0 );
    if ( pCut == NULL )
        return 0;
    assert( p->pParams->fSeq || pCut->nLeaves > 1 );
    // set the signature
    pCut->uSign = pCut0->uSign | pCut1->uSign;
    if ( p->pParams->fRecord )
        pCut->Num0 = pCut0->Num0, pCut->Num1 = pCut1->Num0;
    // check containment
    if ( p->pParams->fFilter )
    {
        if ( Cut_CutFilterOne(p, pSuperList, pCut) )
//        if ( Cut_CutFilterOneEqual(p, pSuperList, pCut) )
            return 0;
        if ( p->pParams->fSeq )
        {
            if ( p->pCompareOld && Cut_CutFilterOld(p, p->pCompareOld, pCut) )
                return 0;
            if ( p->pCompareNew && Cut_CutFilterOld(p, p->pCompareNew, pCut) )
                return 0;
        }
    }

    if ( p->pParams->fGlobal )
    {
        assert( p->vNodeAttrs != NULL );
        if ( Cut_CutFilterGlobal( p, pCut ) )
            return 0;
    }

    // compute the truth table
    if ( p->pParams->fTruth )
        Cut_TruthCompute( p, pCut, pCut0, pCut1, p->fCompl0, p->fCompl1 );
    // add to the list
    Cut_ListAdd( pSuperList, pCut );
    // return status (0 if okay; 1 if exceeded the limit)
    return ++p->nNodeCuts == p->pParams->nKeepMax;
}